

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall glslang::HlslGrammar::acceptSamplerDeclarationDX9(HlslGrammar *this,TType *param_1)

{
  HlslToken *pHVar1;
  bool bVar2;
  char *pcVar3;
  HlslToken name;
  HlslToken local_38;
  
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSampler);
  if (bVar2) {
    pHVar1 = &(this->super_HlslTokenStream).token;
    (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this->parseContext,pHVar1,"Unimplemented","Direct3D 9 sampler declaration","");
    local_38.field_2.string = (TString *)0x0;
    local_38.loc.name = (TString *)0x0;
    local_38.loc.string = 0;
    local_38.loc.line = 0;
    local_38.loc.column = 0;
    bVar2 = acceptIdentifier(this,&local_38);
    if (bVar2) {
      bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
      if (bVar2) {
        return false;
      }
      pcVar3 = "=";
    }
    else {
      pcVar3 = "sampler name";
    }
    (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this->parseContext,pHVar1,"Expected",pcVar3,"");
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptSamplerDeclarationDX9(TType& /*type*/)
{
    if (! acceptTokenClass(EHTokSampler))
        return false;

    // TODO: remove this when DX9 style declarations are implemented.
    unimplemented("Direct3D 9 sampler declaration");

    // read sampler name
    HlslToken name;
    if (! acceptIdentifier(name)) {
        expected("sampler name");
        return false;
    }

    if (! acceptTokenClass(EHTokAssign)) {
        expected("=");
        return false;
    }

    return false;
}